

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::probe_dominator_lrat(Internal *this,int dom,Clause *reason)

{
  int iVar1;
  uint uVar2;
  Flags FVar3;
  pointer pFVar4;
  pointer pVVar5;
  Clause *reason_00;
  uint uVar6;
  Clause *__range1;
  long lVar7;
  int other;
  uint64_t id;
  uint local_44;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  unsigned_long local_38;
  
  if ((dom != 0) && (this->lrat != false)) {
    iVar1 = reason->size;
    local_40 = &this->lrat_chain;
    for (lVar7 = 0; (long)iVar1 * 4 != lVar7; lVar7 = lVar7 + 4) {
      uVar2 = *(uint *)((long)&reason[1].field_0 + lVar7);
      if ((this->vals[(int)uVar2] < '\0') && (local_44 = -uVar2, local_44 != dom)) {
        uVar6 = -uVar2;
        if (0 < (int)uVar2) {
          uVar6 = uVar2;
        }
        pFVar4 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        FVar3 = pFVar4[uVar6];
        if (((uint)FVar3 & 1) == 0) {
          pFVar4[uVar6] = (Flags)((uint)FVar3 | 1);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this->analyzed,(value_type_conflict3 *)&local_44);
          uVar2 = -local_44;
          if (0 < (int)local_44) {
            uVar2 = local_44;
          }
          pVVar5 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (pVVar5[uVar2].level == 0) {
            local_38 = (this->unit_clauses_idx).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)(uVar2 << 1 | local_44 >> 0x1f)];
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (local_40,&local_38);
          }
          else {
            reason_00 = pVVar5[uVar2].reason;
            if (reason_00 != (Clause *)0x0) {
              probe_dominator_lrat(this,dom,reason_00);
            }
          }
        }
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (local_40,(value_type_conflict5 *)reason);
  }
  return;
}

Assistant:

void Internal::probe_dominator_lrat (int dom, Clause *reason) {
  if (!lrat || !dom)
    return;
  LOG (reason, "probe dominator LRAT for %d from", dom);
  for (const auto lit : *reason) {
    if (val (lit) >= 0)
      continue;
    const auto other = -lit;
    if (other == dom)
      continue;
    Flags &f = flags (other);
    if (f.seen)
      continue;
    f.seen = true;
    analyzed.push_back (other);
    Var u = var (other);
    if (u.level) {
      if (!u.reason) {
        LOG ("this may be a problem %d", other);
        continue;
      }
      probe_dominator_lrat (dom, u.reason);
      continue;
    }
    const unsigned uidx = vlit (other);
    uint64_t id = unit_clauses (uidx);
    assert (id);
    lrat_chain.push_back (id);
  }
  lrat_chain.push_back (reason->id);
}